

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O3

void pybind11::detail::
     vector_if_equal_operator<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>
               (enable_if_t<is_comparable<vector<vector<Link>_>_>::value,_pybind11::class_<std::vector<std::vector<Link>_>,_std::unique_ptr<std::vector<std::vector<Link>_>_>_>_>
                *cl)

{
  is_operator local_31;
  arg local_30;
  
  local_30.name =
       (char *)op_impl<(pybind11::detail::op_id)25,_(pybind11::detail::op_type)0,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
               ::execute;
  class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::
  allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::
  allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::
  vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>::
  def<bool(*)(std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std
  ::allocator<Link>>>>const&,std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::
  vector<Link,std::allocator<Link>>>>const&),pybind11::operator>
            ((allocator<Link>>>>const___pybind11 *)cl,"__eq__",
             (_func_bool_vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_ptr_vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_ptr
              **)&local_30,&local_31);
  local_30.name =
       (char *)op_impl<(pybind11::detail::op_id)26,_(pybind11::detail::op_type)0,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>,_std::vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_>
               ::execute;
  class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::
  allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::
  allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::
  vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>::
  def<bool(*)(std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std
  ::allocator<Link>>>>const&,std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::
  vector<Link,std::allocator<Link>>>>const&),pybind11::operator>
            ((allocator<Link>>>>const___pybind11 *)cl,"__ne__",
             (_func_bool_vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_ptr_vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>_ptr
              **)&local_30,&local_31);
  local_30.name = "x";
  local_30._8_1_ = 2;
  class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>(std::enable_if<is_comparable<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>::value,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>::type&)::_lambda(std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>const&,std::vector<Link,std::allocator<Link>>const&)_1_,pybind11::arg,char[53]>
            ((class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>
              *)cl,"count",(type *)&local_31,&local_30,
             (char (*) [53])"Return the number of times ``x`` appears in the list");
  local_30.name = "x";
  local_30._8_1_ = 2;
  class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>(std::enable_if<is_comparable<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>::value,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>::type&)::_lambda(std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>&,std::vector<Link,std::allocator<Link>>const&)_1_,pybind11::arg,char[95]>
            ((class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>
              *)cl,"remove",(type *)&local_31,&local_30,
             (char (*) [95])
             "Remove the first item from the list whose value is x. It is an error if there is no such item."
            );
  local_30.name = "x";
  local_30._8_1_ = 2;
  class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>(std::enable_if<is_comparable<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>::value,pybind11::class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>>::type&)::_lambda(std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>const&,std::vector<Link,std::allocator<Link>>const&)_2_,pybind11::arg,char[41]>
            ((class_<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::unique_ptr<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>,std::default_delete<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>>>>
              *)cl,"__contains__",(type *)&local_31,&local_30,
             (char (*) [41])"Return true the container contains ``x``");
  return;
}

Assistant:

void vector_if_equal_operator(enable_if_t<is_comparable<Vector>::value, Class_> &cl) {
    using T = typename Vector::value_type;

    cl.def(self == self);
    cl.def(self != self);

    cl.def("count",
        [](const Vector &v, const T &x) {
            return std::count(v.begin(), v.end(), x);
        },
        arg("x"),
        "Return the number of times ``x`` appears in the list"
    );

    cl.def("remove", [](Vector &v, const T &x) {
            auto p = std::find(v.begin(), v.end(), x);
            if (p != v.end())
                v.erase(p);
            else
                throw value_error();
        },
        arg("x"),
        "Remove the first item from the list whose value is x. "
        "It is an error if there is no such item."
    );

    cl.def("__contains__",
        [](const Vector &v, const T &x) {
            return std::find(v.begin(), v.end(), x) != v.end();
        },
        arg("x"),
        "Return true the container contains ``x``"
    );
}